

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O0

HRESULT Js::JavascriptError::GetRuntimeError(RecyclableObject *errorObject,LPCWSTR *pMessage)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ScriptContext *this;
  ThreadContext *this_00;
  undefined4 *puVar4;
  Var pvVar5;
  JavascriptString *pJVar6;
  undefined4 extraout_var;
  JavascriptError *pJVar7;
  char16_t **ppcVar8;
  double dVar9;
  JavascriptString *messageString;
  Var message;
  Var number;
  ScriptContext *scriptContext;
  HRESULT hr;
  LPCWSTR *pMessage_local;
  RecyclableObject *errorObject_local;
  
  scriptContext._4_4_ = -0x7ff5ec62;
  this = RecyclableObject::GetScriptContext(errorObject);
  this_00 = ScriptContext::GetThreadContext(this);
  bVar2 = ThreadContext::IsScriptActive(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptError.cpp"
                                ,0x225,"(scriptContext->GetThreadContext()->IsScriptActive())",
                                "scriptContext->GetThreadContext()->IsScriptActive()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pvVar5 = Js::JavascriptOperators::GetPropertyNoCache(errorObject,0x10c,this);
  bVar2 = TaggedInt::Is(pvVar5);
  if (bVar2) {
    scriptContext._4_4_ = TaggedInt::ToInt32(pvVar5);
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(pvVar5);
    if (bVar2) {
      dVar9 = JavascriptNumber::GetValue(pvVar5);
      scriptContext._4_4_ = (int32)dVar9;
    }
  }
  if (-1 < scriptContext._4_4_) {
    scriptContext._4_4_ = -0x7fffbffb;
  }
  if (pMessage != (LPCWSTR *)0x0) {
    *pMessage = L"";
    pvVar5 = Js::JavascriptOperators::GetProperty(errorObject,0x102,this,(PropertyValueInfo *)0x0);
    bVar2 = VarIs<Js::JavascriptString>(pvVar5);
    if (bVar2) {
      pJVar6 = VarTo<Js::JavascriptString>(pvVar5);
      iVar3 = (*(pJVar6->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
      *pMessage = (LPCWSTR)CONCAT44(extraout_var,iVar3);
    }
    else {
      bVar2 = VarIs<Js::JavascriptError,Js::RecyclableObject>(errorObject);
      if (bVar2) {
        pJVar7 = VarTo<Js::JavascriptError,Js::RecyclableObject>(errorObject);
        ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                            ((WriteBarrierPtr *)&pJVar7->originalRuntimeErrorMessage);
        if (*ppcVar8 != (char16_t *)0x0) {
          pJVar7 = VarTo<Js::JavascriptError,Js::RecyclableObject>(errorObject);
          ppcVar8 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                              ((WriteBarrierPtr *)&pJVar7->originalRuntimeErrorMessage);
          *pMessage = *ppcVar8;
          return scriptContext._4_4_;
        }
      }
      if ((scriptContext._4_4_ >> 0x10 & 0x1fffU) == 10) {
        *pMessage = (LPCWSTR)0x0;
      }
    }
  }
  return scriptContext._4_4_;
}

Assistant:

HRESULT JavascriptError::GetRuntimeError(RecyclableObject* errorObject, __out_opt LPCWSTR * pMessage)
    {
        // Only report the error number if it is a runtime error
        HRESULT hr = JSERR_UncaughtException;
        ScriptContext* scriptContext = errorObject->GetScriptContext();

        // This version needs to be called in script.
        Assert(scriptContext->GetThreadContext()->IsScriptActive());

        Var number = JavascriptOperators::GetPropertyNoCache(errorObject, Js::PropertyIds::number, scriptContext);
        if (TaggedInt::Is(number))
        {
            hr = TaggedInt::ToInt32(number);
        }
        else if (JavascriptNumber::Is_NoTaggedIntCheck(number))
        {
            hr = (HRESULT)JavascriptNumber::GetValue(number);
        }
        if (!FAILED(hr))
        {
            hr = E_FAIL;
        }

        if (pMessage != NULL)
        {
            *pMessage = _u("");  // default empty-string

            // The message property always overrides any error message
            Var message = Js::JavascriptOperators::GetProperty(errorObject, Js::PropertyIds::message, scriptContext, NULL);
            if (VarIs<JavascriptString>(message))
            {
                // Always report the description to IE if it is a string, even if the user sets it
                JavascriptString * messageString = VarTo<JavascriptString>(message);
                *pMessage = messageString->GetSz();
            }
            else if (Js::VarIs<Js::JavascriptError>(errorObject) && Js::VarTo<Js::JavascriptError>(errorObject)->originalRuntimeErrorMessage != nullptr)
            {
                // use the runtime error message
                *pMessage = Js::VarTo<Js::JavascriptError>(errorObject)->originalRuntimeErrorMessage;
            }
            else if (FACILITY_CONTROL == HRESULT_FACILITY(hr))
            {
                // User might have create it's own Error object with JS error code, try to load the
                // resource string from the HResult by returning null;
                *pMessage = nullptr;
            }
        }

        // If neither the message or original runtime error message is set, and there are no error message.
        // Then just return false and we will report Uncaught exception
        return hr;
    }